

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtGroup::init
          (CreateContextExtGroup *this,EVP_PKEY_CTX *ctx)

{
  EGLenum api;
  EglTestContext *eglTestCtx;
  void *pvVar1;
  FilterList *pFVar2;
  ConfigFilter filter_00;
  CreateContextExtCase *this_00;
  reference attribList;
  undefined1 local_358 [8];
  FilterList filter;
  int groupNdx;
  anon_struct_40_5_35c6d6ef groups [20];
  CreateContextExtGroup *this_local;
  
  pvVar1 = memcpy(&stack0xfffffffffffffcc8,&PTR_anon_var_dwarf_afbe4f_03279930,800);
  filter.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while ((int)filter.m_rules.
              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0x14) {
    eglu::FilterList::FilterList((FilterList *)local_358);
    pFVar2 = eglu::FilterList::operator<<
                       ((FilterList *)local_358,
                        (ConfigFilter)
                        groups[(int)filter.m_rules.
                                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].
                        description);
    pFVar2 = eglu::FilterList::operator<<
                       (pFVar2,groups[(int)filter.m_rules.
                                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]
                               .colorFilter);
    pFVar2 = eglu::FilterList::operator<<
                       (pFVar2,groups[(int)filter.m_rules.
                                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]
                               .depthFilter);
    filter_00 = getRenderableFilter(this->m_apiBit);
    eglu::FilterList::operator<<(pFVar2,filter_00);
    this_00 = (CreateContextExtCase *)operator_new(0xe0);
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    api = this->m_api;
    attribList = std::vector<int,_std::allocator<int>_>::operator[](&this->m_attribList,0);
    CreateContextExtCase::CreateContextExtCase
              (this_00,eglTestCtx,api,attribList,(FilterList *)local_358,
               *(char **)(&stack0xfffffffffffffcc8 +
                         (long)(int)filter.m_rules.
                                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0x28)
               ,groups[(int)filter.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].name);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    eglu::FilterList::~FilterList((FilterList *)local_358);
    filter.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         filter.m_rules.
         super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    pvVar1 = (void *)(ulong)filter.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return (int)pvVar1;
}

Assistant:

void CreateContextExtGroup::init (void)
{
	const struct
	{
		const char*				name;
		const char*				description;

		eglu::ConfigFilter		colorFilter;
		eglu::ConfigFilter		depthFilter;
		eglu::ConfigFilter		stencilFilter;
	} groups[] =
	{
		{ "rgb565_no_depth_no_stencil",		"RGB565 configs without depth or stencil",		colorBits<5, 6, 5, 0>, noDepth,		noStencil	},
		{ "rgb565_no_depth_stencil",		"RGB565 configs with stencil and no depth",		colorBits<5, 6, 5, 0>, noDepth,		hasStencil	},
		{ "rgb565_depth_no_stencil",		"RGB565 configs with depth and no stencil",		colorBits<5, 6, 5, 0>, hasDepth,	noStencil	},
		{ "rgb565_depth_stencil",			"RGB565 configs with depth and stencil",		colorBits<5, 6, 5, 0>, hasDepth,	hasStencil	},

		{ "rgb888_no_depth_no_stencil",		"RGB888 configs without depth or stencil",		colorBits<8, 8, 8, 0>, noDepth,		noStencil	},
		{ "rgb888_no_depth_stencil",		"RGB888 configs with stencil and no depth",		colorBits<8, 8, 8, 0>, noDepth,		hasStencil	},
		{ "rgb888_depth_no_stencil",		"RGB888 configs with depth and no stencil",		colorBits<8, 8, 8, 0>, hasDepth,	noStencil	},
		{ "rgb888_depth_stencil",			"RGB888 configs with depth and stencil",		colorBits<8, 8, 8, 0>, hasDepth,	hasStencil	},

		{ "rgba4444_no_depth_no_stencil",	"RGBA4444 configs without depth or stencil",	colorBits<4, 4, 4, 4>, noDepth,		noStencil	},
		{ "rgba4444_no_depth_stencil",		"RGBA4444 configs with stencil and no depth",	colorBits<4, 4, 4, 4>, noDepth,		hasStencil	},
		{ "rgba4444_depth_no_stencil",		"RGBA4444 configs with depth and no stencil",	colorBits<4, 4, 4, 4>, hasDepth,	noStencil	},
		{ "rgba4444_depth_stencil",			"RGBA4444 configs with depth and stencil",		colorBits<4, 4, 4, 4>, hasDepth,	hasStencil	},

		{ "rgba5551_no_depth_no_stencil",	"RGBA5551 configs without depth or stencil",	colorBits<5, 5, 5, 1>, noDepth,		noStencil	},
		{ "rgba5551_no_depth_stencil",		"RGBA5551 configs with stencil and no depth",	colorBits<5, 5, 5, 1>, noDepth,		hasStencil	},
		{ "rgba5551_depth_no_stencil",		"RGBA5551 configs with depth and no stencil",	colorBits<5, 5, 5, 1>, hasDepth,	noStencil	},
		{ "rgba5551_depth_stencil",			"RGBA5551 configs with depth and stencil",		colorBits<5, 5, 5, 1>, hasDepth,	hasStencil	},

		{ "rgba8888_no_depth_no_stencil",	"RGBA8888 configs without depth or stencil",	colorBits<8, 8, 8, 8>, noDepth,		noStencil	},
		{ "rgba8888_no_depth_stencil",		"RGBA8888 configs with stencil and no depth",	colorBits<8, 8, 8, 8>, noDepth,		hasStencil	},
		{ "rgba8888_depth_no_stencil",		"RGBA8888 configs with depth and no stencil",	colorBits<8, 8, 8, 8>, hasDepth,	noStencil	},
		{ "rgba8888_depth_stencil",			"RGBA8888 configs with depth and stencil",		colorBits<8, 8, 8, 8>, hasDepth,	hasStencil	}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(groups); groupNdx++)
	{
		eglu::FilterList filter;

		filter << groups[groupNdx].colorFilter
			   << groups[groupNdx].depthFilter
			   << groups[groupNdx].stencilFilter
			   << getRenderableFilter(m_apiBit);

		addChild(new CreateContextExtCase(m_eglTestCtx, m_api, &(m_attribList[0]), filter, groups[groupNdx].name, groups[groupNdx].description));
	}
	// \todo [mika] Add other group
}